

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

int32_t ucptrie_internalSmallIndex_63(UCPTrie *trie,UChar32 c)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint local_24;
  int32_t dataBlock;
  int32_t i3;
  int32_t i3Block;
  int32_t i1;
  UChar32 c_local;
  UCPTrie *trie_local;
  
  if (trie->type == '\0') {
    i3 = (c >> 0xe) + 0x3fc;
  }
  else {
    i3 = (c >> 0xe) + 0x40;
  }
  uVar1 = trie->index[(int)((uint)trie->index[i3] + (c >> 9 & 0x1fU))];
  uVar2 = c >> 4;
  if ((uVar1 & 0x8000) == 0) {
    local_24 = (uint)trie->index[(int)((uint)uVar1 + (uVar2 & 0x1f))];
  }
  else {
    iVar3 = (uVar1 & 0x7fff) + (uVar2 & 0x18) + ((int)(uVar2 & 0x1f) >> 3);
    local_24 = (uint)trie->index[(int)(iVar3 + 1 + (uVar2 & 7))] |
               (uint)trie->index[iVar3] << (char)((uVar2 & 7) << 1) + 2 & 0x30000;
  }
  return local_24 + (c & 0xfU);
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_internalSmallIndex(const UCPTrie *trie, UChar32 c) {
    int32_t i1 = c >> UCPTRIE_SHIFT_1;
    if (trie->type == UCPTRIE_TYPE_FAST) {
        U_ASSERT(0xffff < c && c < trie->highStart);
        i1 += UCPTRIE_BMP_INDEX_LENGTH - UCPTRIE_OMITTED_BMP_INDEX_1_LENGTH;
    } else {
        U_ASSERT((uint32_t)c < (uint32_t)trie->highStart && trie->highStart > UCPTRIE_SMALL_LIMIT);
        i1 += UCPTRIE_SMALL_INDEX_LENGTH;
    }
    int32_t i3Block = trie->index[
        (int32_t)trie->index[i1] + ((c >> UCPTRIE_SHIFT_2) & UCPTRIE_INDEX_2_MASK)];
    int32_t i3 = (c >> UCPTRIE_SHIFT_3) & UCPTRIE_INDEX_3_MASK;
    int32_t dataBlock;
    if ((i3Block & 0x8000) == 0) {
        // 16-bit indexes
        dataBlock = trie->index[i3Block + i3];
    } else {
        // 18-bit indexes stored in groups of 9 entries per 8 indexes.
        i3Block = (i3Block & 0x7fff) + (i3 & ~7) + (i3 >> 3);
        i3 &= 7;
        dataBlock = ((int32_t)trie->index[i3Block++] << (2 + (2 * i3))) & 0x30000;
        dataBlock |= trie->index[i3Block + i3];
    }
    return dataBlock + (c & UCPTRIE_SMALL_DATA_MASK);
}